

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asm_v_wasm.cpp
# Opt level: O3

JsType wasm::wasmToJsType(Type type)

{
  bool bVar1;
  JsType JVar2;
  char *__assertion;
  Type local_10;
  Type type_local;
  
  local_10.id = type.id;
  bVar1 = Type::isTuple(&local_10);
  if (!bVar1) {
    switch(local_10.id) {
    case 0:
      JVar2 = JS_NONE;
      break;
    case 1:
      handle_unreachable("invalid type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/asmjs/asm_v_wasm.cpp"
                         ,0x27);
    case 2:
      JVar2 = JS_INT;
      break;
    case 3:
      JVar2 = JS_INT64;
      break;
    case 4:
      JVar2 = JS_FLOAT;
      break;
    case 5:
      JVar2 = JS_DOUBLE;
      break;
    case 6:
      handle_unreachable("v128 not implemented yet",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/asmjs/asm_v_wasm.cpp"
                         ,0x23);
    default:
      __assertion = "type.isBasic() && \"TODO: handle compound types\"";
      goto LAB_00a5ef67;
    }
    return JVar2;
  }
  __assertion = "!type.isTuple() && \"Unexpected tuple type\"";
LAB_00a5ef67:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/asmjs/asm_v_wasm.cpp"
                ,0x18,"JsType wasm::wasmToJsType(Type)");
}

Assistant:

JsType wasmToJsType(Type type) {
  TODO_SINGLE_COMPOUND(type);
  switch (type.getBasic()) {
    case Type::i32:
      return JS_INT;
    case Type::f32:
      return JS_FLOAT;
    case Type::f64:
      return JS_DOUBLE;
    case Type::i64:
      return JS_INT64;
    case Type::v128:
      WASM_UNREACHABLE("v128 not implemented yet");
    case Type::none:
      return JS_NONE;
    case Type::unreachable:
      WASM_UNREACHABLE("invalid type");
  }
  WASM_UNREACHABLE("invalid type");
}